

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O3

void __thiscall Graph::clear(Graph *this)

{
  pointer pLVar1;
  pointer __s;
  pointer pCVar2;
  pointer pEVar3;
  pointer pEVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  bool *pbVar34;
  ulong uVar35;
  ulong uVar36;
  undefined1 auVar37 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  int iVar57;
  int iVar60;
  int iVar61;
  undefined1 auVar58 [16];
  int iVar62;
  undefined1 auVar59 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  int iVar76;
  int iVar80;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  
  pLVar1 = (this->bridges).super__Vector_base<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->bridges).super__Vector_base<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>.
      _M_impl.super__Vector_impl_data._M_finish != pLVar1) {
    (this->bridges).super__Vector_base<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>._M_impl.
    super__Vector_impl_data._M_finish = pLVar1;
  }
  __s = (this->colorMap).super__Vector_base<Graph::Colors,_std::allocator<Graph::Colors>_>._M_impl.
        super__Vector_impl_data._M_start;
  pCVar2 = (this->colorMap).super__Vector_base<Graph::Colors,_std::allocator<Graph::Colors>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (__s != pCVar2) {
    memset(__s,0,((long)pCVar2 + (-4 - (long)__s) & 0xfffffffffffffffcU) + 4);
  }
  auVar33 = _DAT_00106130;
  auVar32 = _DAT_00106120;
  auVar31 = _DAT_00106110;
  auVar30 = _DAT_00106100;
  auVar29 = _DAT_001060d0;
  auVar28 = _DAT_001060c0;
  auVar27 = _DAT_001060b0;
  pEVar3 = (this->edges).super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
           super__Vector_impl_data._M_start;
  pEVar4 = (this->edges).super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pEVar3 != pEVar4) {
    uVar35 = (long)pEVar4 + (-0x20 - (long)pEVar3);
    auVar58._8_4_ = (int)uVar35;
    auVar58._0_8_ = uVar35;
    auVar58._12_4_ = (int)(uVar35 >> 0x20);
    auVar37._0_8_ = uVar35 >> 5;
    auVar37._8_8_ = auVar58._8_8_ >> 5;
    pbVar34 = &pEVar3[0xf].finished;
    uVar36 = 0;
    do {
      auVar55._8_4_ = (int)uVar36;
      auVar55._0_8_ = uVar36;
      auVar55._12_4_ = (int)(uVar36 >> 0x20);
      auVar58 = auVar37 ^ auVar29;
      auVar63 = (auVar55 | auVar28) ^ auVar29;
      iVar57 = auVar58._0_4_;
      iVar76 = -(uint)(iVar57 < auVar63._0_4_);
      iVar60 = auVar58._4_4_;
      auVar65._4_4_ = -(uint)(iVar60 < auVar63._4_4_);
      iVar61 = auVar58._8_4_;
      iVar80 = -(uint)(iVar61 < auVar63._8_4_);
      iVar62 = auVar58._12_4_;
      auVar65._12_4_ = -(uint)(iVar62 < auVar63._12_4_);
      auVar38._4_4_ = iVar76;
      auVar38._0_4_ = iVar76;
      auVar38._8_4_ = iVar80;
      auVar38._12_4_ = iVar80;
      auVar58 = pshuflw(in_XMM1,auVar38,0xe8);
      auVar64._4_4_ = -(uint)(auVar63._4_4_ == iVar60);
      auVar64._12_4_ = -(uint)(auVar63._12_4_ == iVar62);
      auVar64._0_4_ = auVar64._4_4_;
      auVar64._8_4_ = auVar64._12_4_;
      auVar47 = pshuflw(in_XMM2,auVar64,0xe8);
      auVar65._0_4_ = auVar65._4_4_;
      auVar65._8_4_ = auVar65._12_4_;
      auVar38 = pshuflw(auVar58,auVar65,0xe8);
      auVar63._8_4_ = 0xffffffff;
      auVar63._0_8_ = 0xffffffffffffffff;
      auVar63._12_4_ = 0xffffffff;
      auVar63 = (auVar38 | auVar47 & auVar58) ^ auVar63;
      auVar58 = packssdw(auVar63,auVar63);
      if ((auVar58 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pbVar34[-0x1e0] = false;
      }
      auVar14._4_4_ = iVar76;
      auVar14._0_4_ = iVar76;
      auVar14._8_4_ = iVar80;
      auVar14._12_4_ = iVar80;
      auVar65 = auVar64 & auVar14 | auVar65;
      auVar58 = packssdw(auVar65,auVar65);
      auVar47._8_4_ = 0xffffffff;
      auVar47._0_8_ = 0xffffffffffffffff;
      auVar47._12_4_ = 0xffffffff;
      auVar58 = packssdw(auVar58 ^ auVar47,auVar58 ^ auVar47);
      auVar58 = packsswb(auVar58,auVar58);
      if ((auVar58._0_4_ >> 8 & 1) != 0) {
        pbVar34[-0x1c0] = false;
      }
      auVar58 = (auVar55 | auVar27) ^ auVar29;
      auVar48._0_4_ = -(uint)(iVar57 < auVar58._0_4_);
      auVar48._4_4_ = -(uint)(iVar60 < auVar58._4_4_);
      auVar48._8_4_ = -(uint)(iVar61 < auVar58._8_4_);
      auVar48._12_4_ = -(uint)(iVar62 < auVar58._12_4_);
      auVar66._4_4_ = auVar48._0_4_;
      auVar66._0_4_ = auVar48._0_4_;
      auVar66._8_4_ = auVar48._8_4_;
      auVar66._12_4_ = auVar48._8_4_;
      iVar76 = -(uint)(auVar58._4_4_ == iVar60);
      iVar80 = -(uint)(auVar58._12_4_ == iVar62);
      auVar15._4_4_ = iVar76;
      auVar15._0_4_ = iVar76;
      auVar15._8_4_ = iVar80;
      auVar15._12_4_ = iVar80;
      auVar77._4_4_ = auVar48._4_4_;
      auVar77._0_4_ = auVar48._4_4_;
      auVar77._8_4_ = auVar48._12_4_;
      auVar77._12_4_ = auVar48._12_4_;
      auVar58 = auVar15 & auVar66 | auVar77;
      auVar58 = packssdw(auVar58,auVar58);
      auVar5._8_4_ = 0xffffffff;
      auVar5._0_8_ = 0xffffffffffffffff;
      auVar5._12_4_ = 0xffffffff;
      auVar58 = packssdw(auVar58 ^ auVar5,auVar58 ^ auVar5);
      auVar58 = packsswb(auVar58,auVar58);
      if ((auVar58._0_4_ >> 0x10 & 1) != 0) {
        pbVar34[-0x1a0] = false;
      }
      auVar58 = pshufhw(auVar58,auVar66,0x84);
      auVar16._4_4_ = iVar76;
      auVar16._0_4_ = iVar76;
      auVar16._8_4_ = iVar80;
      auVar16._12_4_ = iVar80;
      auVar38 = pshufhw(auVar48,auVar16,0x84);
      auVar63 = pshufhw(auVar58,auVar77,0x84);
      auVar39._8_4_ = 0xffffffff;
      auVar39._0_8_ = 0xffffffffffffffff;
      auVar39._12_4_ = 0xffffffff;
      auVar39 = (auVar63 | auVar38 & auVar58) ^ auVar39;
      auVar58 = packssdw(auVar39,auVar39);
      auVar58 = packsswb(auVar58,auVar58);
      if ((auVar58._0_4_ >> 0x18 & 1) != 0) {
        pbVar34[-0x180] = false;
      }
      auVar58 = (auVar55 | auVar33) ^ auVar29;
      auVar49._0_4_ = -(uint)(iVar57 < auVar58._0_4_);
      auVar49._4_4_ = -(uint)(iVar60 < auVar58._4_4_);
      auVar49._8_4_ = -(uint)(iVar61 < auVar58._8_4_);
      auVar49._12_4_ = -(uint)(iVar62 < auVar58._12_4_);
      auVar17._4_4_ = auVar49._0_4_;
      auVar17._0_4_ = auVar49._0_4_;
      auVar17._8_4_ = auVar49._8_4_;
      auVar17._12_4_ = auVar49._8_4_;
      auVar38 = pshuflw(auVar77,auVar17,0xe8);
      auVar40._0_4_ = -(uint)(auVar58._0_4_ == iVar57);
      auVar40._4_4_ = -(uint)(auVar58._4_4_ == iVar60);
      auVar40._8_4_ = -(uint)(auVar58._8_4_ == iVar61);
      auVar40._12_4_ = -(uint)(auVar58._12_4_ == iVar62);
      auVar67._4_4_ = auVar40._4_4_;
      auVar67._0_4_ = auVar40._4_4_;
      auVar67._8_4_ = auVar40._12_4_;
      auVar67._12_4_ = auVar40._12_4_;
      auVar58 = pshuflw(auVar40,auVar67,0xe8);
      auVar68._4_4_ = auVar49._4_4_;
      auVar68._0_4_ = auVar49._4_4_;
      auVar68._8_4_ = auVar49._12_4_;
      auVar68._12_4_ = auVar49._12_4_;
      auVar63 = pshuflw(auVar49,auVar68,0xe8);
      auVar6._8_4_ = 0xffffffff;
      auVar6._0_8_ = 0xffffffffffffffff;
      auVar6._12_4_ = 0xffffffff;
      auVar58 = packssdw(auVar58 & auVar38,(auVar63 | auVar58 & auVar38) ^ auVar6);
      auVar58 = packsswb(auVar58,auVar58);
      if ((auVar58 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        pbVar34[-0x160] = false;
      }
      auVar18._4_4_ = auVar49._0_4_;
      auVar18._0_4_ = auVar49._0_4_;
      auVar18._8_4_ = auVar49._8_4_;
      auVar18._12_4_ = auVar49._8_4_;
      auVar68 = auVar67 & auVar18 | auVar68;
      auVar63 = packssdw(auVar68,auVar68);
      auVar7._8_4_ = 0xffffffff;
      auVar7._0_8_ = 0xffffffffffffffff;
      auVar7._12_4_ = 0xffffffff;
      auVar58 = packssdw(auVar58,auVar63 ^ auVar7);
      auVar58 = packsswb(auVar58,auVar58);
      if ((auVar58._4_2_ >> 8 & 1) != 0) {
        pbVar34[-0x140] = false;
      }
      auVar58 = (auVar55 | auVar32) ^ auVar29;
      auVar50._0_4_ = -(uint)(iVar57 < auVar58._0_4_);
      auVar50._4_4_ = -(uint)(iVar60 < auVar58._4_4_);
      auVar50._8_4_ = -(uint)(iVar61 < auVar58._8_4_);
      auVar50._12_4_ = -(uint)(iVar62 < auVar58._12_4_);
      auVar69._4_4_ = auVar50._0_4_;
      auVar69._0_4_ = auVar50._0_4_;
      auVar69._8_4_ = auVar50._8_4_;
      auVar69._12_4_ = auVar50._8_4_;
      iVar76 = -(uint)(auVar58._4_4_ == iVar60);
      iVar80 = -(uint)(auVar58._12_4_ == iVar62);
      auVar19._4_4_ = iVar76;
      auVar19._0_4_ = iVar76;
      auVar19._8_4_ = iVar80;
      auVar19._12_4_ = iVar80;
      auVar78._4_4_ = auVar50._4_4_;
      auVar78._0_4_ = auVar50._4_4_;
      auVar78._8_4_ = auVar50._12_4_;
      auVar78._12_4_ = auVar50._12_4_;
      auVar58 = auVar19 & auVar69 | auVar78;
      auVar58 = packssdw(auVar58,auVar58);
      auVar8._8_4_ = 0xffffffff;
      auVar8._0_8_ = 0xffffffffffffffff;
      auVar8._12_4_ = 0xffffffff;
      auVar58 = packssdw(auVar58 ^ auVar8,auVar58 ^ auVar8);
      auVar58 = packsswb(auVar58,auVar58);
      if ((auVar58 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        pbVar34[-0x120] = false;
      }
      auVar58 = pshufhw(auVar58,auVar69,0x84);
      auVar20._4_4_ = iVar76;
      auVar20._0_4_ = iVar76;
      auVar20._8_4_ = iVar80;
      auVar20._12_4_ = iVar80;
      auVar38 = pshufhw(auVar50,auVar20,0x84);
      auVar63 = pshufhw(auVar58,auVar78,0x84);
      auVar41._8_4_ = 0xffffffff;
      auVar41._0_8_ = 0xffffffffffffffff;
      auVar41._12_4_ = 0xffffffff;
      auVar41 = (auVar63 | auVar38 & auVar58) ^ auVar41;
      auVar58 = packssdw(auVar41,auVar41);
      auVar58 = packsswb(auVar58,auVar58);
      if ((auVar58._6_2_ >> 8 & 1) != 0) {
        pbVar34[-0x100] = false;
      }
      auVar58 = (auVar55 | auVar31) ^ auVar29;
      auVar51._0_4_ = -(uint)(iVar57 < auVar58._0_4_);
      auVar51._4_4_ = -(uint)(iVar60 < auVar58._4_4_);
      auVar51._8_4_ = -(uint)(iVar61 < auVar58._8_4_);
      auVar51._12_4_ = -(uint)(iVar62 < auVar58._12_4_);
      auVar21._4_4_ = auVar51._0_4_;
      auVar21._0_4_ = auVar51._0_4_;
      auVar21._8_4_ = auVar51._8_4_;
      auVar21._12_4_ = auVar51._8_4_;
      auVar38 = pshuflw(auVar78,auVar21,0xe8);
      auVar42._0_4_ = -(uint)(auVar58._0_4_ == iVar57);
      auVar42._4_4_ = -(uint)(auVar58._4_4_ == iVar60);
      auVar42._8_4_ = -(uint)(auVar58._8_4_ == iVar61);
      auVar42._12_4_ = -(uint)(auVar58._12_4_ == iVar62);
      auVar70._4_4_ = auVar42._4_4_;
      auVar70._0_4_ = auVar42._4_4_;
      auVar70._8_4_ = auVar42._12_4_;
      auVar70._12_4_ = auVar42._12_4_;
      auVar58 = pshuflw(auVar42,auVar70,0xe8);
      auVar71._4_4_ = auVar51._4_4_;
      auVar71._0_4_ = auVar51._4_4_;
      auVar71._8_4_ = auVar51._12_4_;
      auVar71._12_4_ = auVar51._12_4_;
      auVar63 = pshuflw(auVar51,auVar71,0xe8);
      auVar52._8_4_ = 0xffffffff;
      auVar52._0_8_ = 0xffffffffffffffff;
      auVar52._12_4_ = 0xffffffff;
      auVar52 = (auVar63 | auVar58 & auVar38) ^ auVar52;
      auVar63 = packssdw(auVar52,auVar52);
      auVar58 = packsswb(auVar58 & auVar38,auVar63);
      if ((auVar58 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pbVar34[-0xe0] = false;
      }
      auVar22._4_4_ = auVar51._0_4_;
      auVar22._0_4_ = auVar51._0_4_;
      auVar22._8_4_ = auVar51._8_4_;
      auVar22._12_4_ = auVar51._8_4_;
      auVar71 = auVar70 & auVar22 | auVar71;
      auVar63 = packssdw(auVar71,auVar71);
      auVar9._8_4_ = 0xffffffff;
      auVar9._0_8_ = 0xffffffffffffffff;
      auVar9._12_4_ = 0xffffffff;
      auVar63 = packssdw(auVar63 ^ auVar9,auVar63 ^ auVar9);
      auVar58 = packsswb(auVar58,auVar63);
      if ((auVar58._8_2_ >> 8 & 1) != 0) {
        pbVar34[-0xc0] = false;
      }
      auVar58 = (auVar55 | auVar30) ^ auVar29;
      auVar53._0_4_ = -(uint)(iVar57 < auVar58._0_4_);
      auVar53._4_4_ = -(uint)(iVar60 < auVar58._4_4_);
      auVar53._8_4_ = -(uint)(iVar61 < auVar58._8_4_);
      auVar53._12_4_ = -(uint)(iVar62 < auVar58._12_4_);
      auVar72._4_4_ = auVar53._0_4_;
      auVar72._0_4_ = auVar53._0_4_;
      auVar72._8_4_ = auVar53._8_4_;
      auVar72._12_4_ = auVar53._8_4_;
      iVar76 = -(uint)(auVar58._4_4_ == iVar60);
      iVar80 = -(uint)(auVar58._12_4_ == iVar62);
      auVar23._4_4_ = iVar76;
      auVar23._0_4_ = iVar76;
      auVar23._8_4_ = iVar80;
      auVar23._12_4_ = iVar80;
      auVar79._4_4_ = auVar53._4_4_;
      auVar79._0_4_ = auVar53._4_4_;
      auVar79._8_4_ = auVar53._12_4_;
      auVar79._12_4_ = auVar53._12_4_;
      auVar58 = auVar23 & auVar72 | auVar79;
      auVar58 = packssdw(auVar58,auVar58);
      auVar10._8_4_ = 0xffffffff;
      auVar10._0_8_ = 0xffffffffffffffff;
      auVar10._12_4_ = 0xffffffff;
      auVar58 = packssdw(auVar58 ^ auVar10,auVar58 ^ auVar10);
      auVar58 = packsswb(auVar58,auVar58);
      if ((auVar58 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        pbVar34[-0xa0] = false;
      }
      auVar58 = pshufhw(auVar58,auVar72,0x84);
      auVar24._4_4_ = iVar76;
      auVar24._0_4_ = iVar76;
      auVar24._8_4_ = iVar80;
      auVar24._12_4_ = iVar80;
      auVar38 = pshufhw(auVar53,auVar24,0x84);
      auVar63 = pshufhw(auVar58,auVar79,0x84);
      auVar43._8_4_ = 0xffffffff;
      auVar43._0_8_ = 0xffffffffffffffff;
      auVar43._12_4_ = 0xffffffff;
      auVar43 = (auVar63 | auVar38 & auVar58) ^ auVar43;
      auVar58 = packssdw(auVar43,auVar43);
      auVar58 = packsswb(auVar58,auVar58);
      if ((auVar58._10_2_ >> 8 & 1) != 0) {
        pbVar34[-0x80] = false;
      }
      auVar58 = (auVar55 | _DAT_001060f0) ^ auVar29;
      auVar54._0_4_ = -(uint)(iVar57 < auVar58._0_4_);
      auVar54._4_4_ = -(uint)(iVar60 < auVar58._4_4_);
      auVar54._8_4_ = -(uint)(iVar61 < auVar58._8_4_);
      auVar54._12_4_ = -(uint)(iVar62 < auVar58._12_4_);
      auVar25._4_4_ = auVar54._0_4_;
      auVar25._0_4_ = auVar54._0_4_;
      auVar25._8_4_ = auVar54._8_4_;
      auVar25._12_4_ = auVar54._8_4_;
      auVar38 = pshuflw(auVar79,auVar25,0xe8);
      auVar44._0_4_ = -(uint)(auVar58._0_4_ == iVar57);
      auVar44._4_4_ = -(uint)(auVar58._4_4_ == iVar60);
      auVar44._8_4_ = -(uint)(auVar58._8_4_ == iVar61);
      auVar44._12_4_ = -(uint)(auVar58._12_4_ == iVar62);
      auVar73._4_4_ = auVar44._4_4_;
      auVar73._0_4_ = auVar44._4_4_;
      auVar73._8_4_ = auVar44._12_4_;
      auVar73._12_4_ = auVar44._12_4_;
      auVar58 = pshuflw(auVar44,auVar73,0xe8);
      auVar74._4_4_ = auVar54._4_4_;
      auVar74._0_4_ = auVar54._4_4_;
      auVar74._8_4_ = auVar54._12_4_;
      auVar74._12_4_ = auVar54._12_4_;
      auVar63 = pshuflw(auVar54,auVar74,0xe8);
      auVar11._8_4_ = 0xffffffff;
      auVar11._0_8_ = 0xffffffffffffffff;
      auVar11._12_4_ = 0xffffffff;
      auVar58 = packssdw(auVar58 & auVar38,(auVar63 | auVar58 & auVar38) ^ auVar11);
      auVar58 = packsswb(auVar58,auVar58);
      if ((auVar58 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        pbVar34[-0x60] = false;
      }
      auVar26._4_4_ = auVar54._0_4_;
      auVar26._0_4_ = auVar54._0_4_;
      auVar26._8_4_ = auVar54._8_4_;
      auVar26._12_4_ = auVar54._8_4_;
      auVar74 = auVar73 & auVar26 | auVar74;
      auVar63 = packssdw(auVar74,auVar74);
      auVar12._8_4_ = 0xffffffff;
      auVar12._0_8_ = 0xffffffffffffffff;
      auVar12._12_4_ = 0xffffffff;
      auVar58 = packssdw(auVar58,auVar63 ^ auVar12);
      auVar58 = packsswb(auVar58,auVar58);
      if ((auVar58._12_2_ >> 8 & 1) != 0) {
        pbVar34[-0x40] = false;
      }
      auVar58 = (auVar55 | _DAT_001060e0) ^ auVar29;
      auVar45._0_4_ = -(uint)(iVar57 < auVar58._0_4_);
      auVar45._4_4_ = -(uint)(iVar60 < auVar58._4_4_);
      auVar45._8_4_ = -(uint)(iVar61 < auVar58._8_4_);
      auVar45._12_4_ = -(uint)(iVar62 < auVar58._12_4_);
      auVar75._4_4_ = auVar45._0_4_;
      auVar75._0_4_ = auVar45._0_4_;
      auVar75._8_4_ = auVar45._8_4_;
      auVar75._12_4_ = auVar45._8_4_;
      auVar56._4_4_ = -(uint)(auVar58._4_4_ == iVar60);
      auVar56._12_4_ = -(uint)(auVar58._12_4_ == iVar62);
      auVar56._0_4_ = auVar56._4_4_;
      auVar56._8_4_ = auVar56._12_4_;
      auVar59._4_4_ = auVar45._4_4_;
      auVar59._0_4_ = auVar45._4_4_;
      auVar59._8_4_ = auVar45._12_4_;
      auVar59._12_4_ = auVar45._12_4_;
      auVar63 = auVar56 & auVar75 | auVar59;
      auVar58 = packssdw(auVar45,auVar63);
      auVar13._8_4_ = 0xffffffff;
      auVar13._0_8_ = 0xffffffffffffffff;
      auVar13._12_4_ = 0xffffffff;
      auVar58 = packssdw(auVar58 ^ auVar13,auVar58 ^ auVar13);
      auVar58 = packsswb(auVar58,auVar58);
      if ((auVar58 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        pbVar34[-0x20] = false;
      }
      auVar58 = pshufhw(auVar58,auVar75,0x84);
      auVar63 = pshufhw(auVar63,auVar56,0x84);
      in_XMM2 = auVar63 & auVar58;
      auVar58 = pshufhw(auVar58,auVar59,0x84);
      auVar46._8_4_ = 0xffffffff;
      auVar46._0_8_ = 0xffffffffffffffff;
      auVar46._12_4_ = 0xffffffff;
      auVar46 = (auVar58 | in_XMM2) ^ auVar46;
      auVar58 = packssdw(auVar46,auVar46);
      in_XMM1 = packsswb(auVar58,auVar58);
      if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
        *pbVar34 = false;
      }
      uVar36 = uVar36 + 0x10;
      pbVar34 = pbVar34 + 0x200;
    } while (((uVar35 >> 5) + 0x10 & 0xfffffffffffffff0) != uVar36);
  }
  return;
}

Assistant:

void Graph::clear() {
    bridges.clear();
    for (auto &c : colorMap)
        c = Colors::White;
    for (auto &e : edges)
        e.finished = false;
}